

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SliceBySizeLayerParams::SerializeWithCachedSizes
          (SliceBySizeLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SliceBySizeLayerParams *this_local;
  
  iVar1 = size(this);
  if (iVar1 != 0) {
    iVar1 = size(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar1,output);
  }
  iVar1 = axis(this);
  if (iVar1 != 0) {
    iVar1 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(3,iVar1,output);
  }
  return;
}

Assistant:

void SliceBySizeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceBySizeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 size = 2;
  if (this->size() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->size(), output);
  }

  // int64 axis = 3;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(3, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceBySizeLayerParams)
}